

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O0

char * MyGame_Example_TestBase64_parse_json_table
                 (flatcc_json_parser_t *ctx,char *buf,char *end,flatcc_builder_ref_t *result)

{
  int iVar1;
  flatcc_builder_ref_t fVar2;
  uint64_t uVar3;
  flatcc_builder_ref_t *pfVar4;
  char *pcVar5;
  uint64_t w;
  char *mark;
  flatcc_builder_ref_t *pref;
  flatcc_builder_ref_t ref;
  void *pval;
  flatcc_builder_ref_t *pfStack_30;
  int more;
  flatcc_builder_ref_t *result_local;
  char *end_local;
  char *buf_local;
  flatcc_json_parser_t *ctx_local;
  
  *result = 0;
  pfStack_30 = result;
  result_local = (flatcc_builder_ref_t *)end;
  end_local = buf;
  buf_local = (char *)ctx;
  iVar1 = flatcc_builder_start_table(ctx->ctx,3);
  if (iVar1 == 0) {
    end_local = flatcc_json_parser_object_start
                          ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                           (int *)((long)&pval + 4));
    while (pval._4_4_ != 0) {
      end_local = flatcc_json_parser_symbol_start
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      uVar3 = flatcc_json_parser_symbol_part(end_local,(char *)result_local);
      pcVar5 = end_local;
      if (uVar3 < 0x6e65737465640000) {
        if ((uVar3 & 0xffffffff00000000) == 0x6461746100000000) {
          end_local = flatcc_json_parser_match_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,4)
          ;
          if (pcVar5 == end_local) {
            end_local = flatcc_json_parser_unmatched_symbol
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local)
            ;
          }
          else {
            end_local = flatcc_json_parser_build_uint8_vector_base64
                                  ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                   (flatcc_builder_ref_t *)((long)&pref + 4),0);
            if ((pref._4_4_ == 0) ||
               (pfVar4 = flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,0),
               pfVar4 == (flatcc_builder_ref_t *)0x0)) goto LAB_0010bbec;
            *pfVar4 = pref._4_4_;
          }
        }
        else {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
      }
      else if ((uVar3 & 0xffffffffffffff00) == 0x75726c6461746100) {
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,7);
        if (pcVar5 == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
        else {
          end_local = flatcc_json_parser_build_uint8_vector_base64
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                 (flatcc_builder_ref_t *)((long)&pref + 4),1);
          if ((pref._4_4_ == 0) ||
             (pfVar4 = flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,1),
             pfVar4 == (flatcc_builder_ref_t *)0x0)) goto LAB_0010bbec;
          *pfVar4 = pref._4_4_;
        }
      }
      else if ((uVar3 & 0xffffffffffff0000) == 0x6e65737465640000) {
        end_local = flatcc_json_parser_match_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,6);
        if (pcVar5 == end_local) {
          end_local = flatcc_json_parser_unmatched_symbol
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
        }
        else {
          end_local = flatcc_json_parser_build_uint8_vector_base64
                                ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                                 (flatcc_builder_ref_t *)((long)&pref + 4),0);
          if ((pref._4_4_ == 0) ||
             (pfVar4 = flatcc_builder_table_add_offset(*(flatcc_builder_t **)buf_local,2),
             pfVar4 == (flatcc_builder_ref_t *)0x0)) goto LAB_0010bbec;
          *pfVar4 = pref._4_4_;
        }
      }
      else {
        end_local = flatcc_json_parser_unmatched_symbol
                              ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local);
      }
      end_local = flatcc_json_parser_object_end
                            ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,
                             (int *)((long)&pval + 4));
    }
    if (*(int *)(buf_local + 0x20) == 0) {
      fVar2 = flatcc_builder_end_table(*(flatcc_builder_t **)buf_local);
      *pfStack_30 = fVar2;
      if (fVar2 != 0) {
        return end_local;
      }
    }
  }
LAB_0010bbec:
  pcVar5 = flatcc_json_parser_set_error
                     ((flatcc_json_parser_t *)buf_local,end_local,(char *)result_local,0x23);
  return pcVar5;
}

Assistant:

static const char *MyGame_Example_TestBase64_parse_json_table(flatcc_json_parser_t *ctx, const char *buf, const char *end, flatcc_builder_ref_t *result)
{
    int more;
    void *pval;
    flatcc_builder_ref_t ref, *pref;
    const char *mark;
    uint64_t w;

    *result = 0;
    if (flatcc_builder_start_table(ctx->ctx, 3)) goto failed;
    buf = flatcc_json_parser_object_start(ctx, buf, end, &more);
    while (more) {
        buf = flatcc_json_parser_symbol_start(ctx, buf, end);
        w = flatcc_json_parser_symbol_part(buf, end);
        if (w < 0x6e65737465640000) { /* branch "nested" */
            if ((w & 0xffffffff00000000) == 0x6461746100000000) { /* "data" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 4);
                if (mark != buf) {
                    buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, 0);
                    if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 0))) goto failed;
                    *pref = ref;
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "data" */
                buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
            } /* "data" */
        } else { /* branch "nested" */
            if ((w & 0xffffffffffffff00) == 0x75726c6461746100) { /* "urldata" */
                buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 7);
                if (mark != buf) {
                    buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, 1);
                    if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 1))) goto failed;
                    *pref = ref;
                } else {
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                }
            } else { /* "urldata" */
                if ((w & 0xffffffffffff0000) == 0x6e65737465640000) { /* "nested" */
                    buf = flatcc_json_parser_match_symbol(ctx, (mark = buf), end, 6);
                    if (mark != buf) {
                        buf = flatcc_json_parser_build_uint8_vector_base64(ctx, buf, end, &ref, 0);
                        if (!ref || !(pref = flatcc_builder_table_add_offset(ctx->ctx, 2))) goto failed;
                        *pref = ref;
                    } else {
                        buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                    }
                } else { /* "nested" */
                    buf = flatcc_json_parser_unmatched_symbol(ctx, buf, end);
                } /* "nested" */
            } /* "urldata" */
        } /* branch "nested" */
        buf = flatcc_json_parser_object_end(ctx, buf, end, &more);
    }
    if (ctx->error) goto failed;
    if (!(*result = flatcc_builder_end_table(ctx->ctx))) goto failed;
    return buf;
failed:
    return flatcc_json_parser_set_error(ctx, buf, end, flatcc_json_parser_error_runtime);
}